

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_prune_body(nng_http *conn)

{
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    http_set_data(&(conn->res).data,(void *)0x0,0);
  }
  else {
    http_set_data(&(conn->req).data,(void *)0x0,0);
  }
  return;
}

Assistant:

void
nni_http_prune_body(nng_http *conn)
{
	// prune body but leave content-length header intact.
	// This is for HEAD.
	if (conn->client) {
		http_set_data(&conn->req.data, NULL, 0);
	} else {
		http_set_data(&conn->res.data, NULL, 0);
	}
}